

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void t1_dec_refpass_step_mqc(opj_t1_t *t1,flag_t *flagsp,int *datap,int poshalf,int neghalf)

{
  ushort uVar1;
  opj_mqc_t *mqc;
  int iVar2;
  ulong uVar3;
  
  uVar1 = *flagsp;
  if ((uVar1 & 0x5000) == 0x1000) {
    mqc = t1->mqc;
    uVar3 = 0x10;
    if ((uVar1 >> 0xd & 1) == 0) {
      uVar3 = (ulong)(0xf - ((char)uVar1 == '\0'));
    }
    mqc->curctx = mqc->ctxs + uVar3;
    iVar2 = mqc_decode(mqc);
    if (iVar2 == 0) {
      poshalf = neghalf;
    }
    iVar2 = -poshalf;
    if (-1 < *datap) {
      iVar2 = poshalf;
    }
    *datap = iVar2 + *datap;
    *(byte *)((long)flagsp + 1) = *(byte *)((long)flagsp + 1) | 0x20;
  }
  return;
}

Assistant:

static INLINE void t1_dec_refpass_step_mqc(
		opj_t1_t *t1,
		flag_t *flagsp,
		int *datap,
		int poshalf,
		int neghalf)
{
	int v, t, flag;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	flag = *flagsp;
	if ((flag & (T1_SIG | T1_VISIT)) == T1_SIG) {
		mqc_setcurctx(mqc, t1_getctxno_mag(flag));	/* ESSAI */
			v = mqc_decode(mqc);
		t = v ? poshalf : neghalf;
		*datap += *datap < 0 ? -t : t;
		*flagsp |= T1_REFINE;
		}
}